

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

void arti_speak(obj *obj)

{
  int truth;
  char *pcVar1;
  artifact *local_130;
  char local_128 [8];
  char buf [256];
  char *local_20;
  char *line;
  artifact *oart;
  obj *obj_local;
  
  if ((obj == (obj *)0x0) || (obj->oartifact == '\0')) {
    local_130 = (artifact *)0x0;
  }
  else {
    local_130 = artilist + (int)obj->oartifact;
  }
  if ((local_130 != (artifact *)0x0) && ((local_130->spfx & 8) != 0)) {
    truth = bcsign(obj);
    local_20 = getrumor(truth,local_128,'\x01');
    if (*local_20 == '\0') {
      local_20 = "Rumors file closed for renovation.";
    }
    pcVar1 = Tobjnam(obj,"whisper");
    pline("%s:",pcVar1);
    verbalize("%s",local_20);
  }
  return;
}

Assistant:

void arti_speak(struct obj *obj)
{
	const struct artifact *oart = get_artifact(obj);
	const char *line;
	char buf[BUFSZ];


	/* Is this a speaking artifact? */
	if (!oart || !(oart->spfx & SPFX_SPEAK))
		return;

	line = getrumor(bcsign(obj), buf, TRUE);
	if (!*line)
		line = "Rumors file closed for renovation.";
	pline("%s:", Tobjnam(obj, "whisper"));
	verbalize("%s", line);
	return;
}